

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmModule * CompileVm(ExpressionContext *ctx,ExprBase *expression,char *code)

{
  long lVar1;
  Allocator *allocator;
  SynBase *source;
  ScopeData *scope;
  FunctionData *pFVar2;
  VmType VVar3;
  VmType VVar4;
  VmType VVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  VmModule *this;
  VmFunction *pVVar11;
  VariableData **ppVVar12;
  TypeBase **ppTVar13;
  FunctionData **ppFVar14;
  VmFunction *this_00;
  ExprBase **ppEVar15;
  VmBlock *block_00;
  VmType VVar16;
  VmBlock *local_110;
  ExprBase *value_1;
  ExprBase *value;
  VmBlock *block;
  uint i_3;
  FunctionData *function_1;
  VariableData *pVStack_e0;
  uint i_2;
  VariableData *variable_1;
  undefined4 uStack_d0;
  uint k_1;
  TypeBase *pTStack_c8;
  VmType local_c0;
  VmFunction *local_b0;
  VmFunction *vmFunction;
  FunctionData *function;
  uint i_1;
  uint i;
  VariableData *variable;
  uint k;
  VmType VStack_88;
  VmType local_78;
  VmFunction *local_60;
  VmFunction *global;
  VmModule *module;
  ExprModule *node;
  TraceScope traceScope;
  char *code_local;
  ExprBase *expression_local;
  ExpressionContext *ctx_local;
  
  if ((CompileVm(ExpressionContext&,ExprBase*,char_const*)::token == '\0') &&
     (iVar7 = __cxa_guard_acquire(&CompileVm(ExpressionContext&,ExprBase*,char_const*)::token),
     iVar7 != 0)) {
    CompileVm::token = NULLC::TraceGetToken("InstructionTreeVm","CompileVm");
    __cxa_guard_release(&CompileVm(ExpressionContext&,ExprBase*,char_const*)::token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)&node,CompileVm::token);
  module = (VmModule *)getType<ExprModule>(expression);
  VVar5.structType = pTStack_c8;
  VVar5.type = uStack_d0;
  VVar5.size = k_1;
  VVar16.structType = local_c0.structType;
  VVar16.type = local_c0.type;
  VVar16.size = local_c0.size;
  if (module == (VmModule *)0x0) {
    ctx_local = (ExpressionContext *)0x0;
  }
  else {
    this = ExpressionContext::get<VmModule>(ctx);
    VmModule::VmModule(this,ctx->allocator,code);
    global = (VmFunction *)this;
    pVVar11 = VmModule::get<VmFunction>(this);
    local_78 = VmType::Void;
    VStack_88 = VmType::Void;
    VmFunction::VmFunction
              (pVVar11,(Allocator *)global[0xf].super_VmValue.comment.begin,VmType::Void,
               (SynBase *)(module->functions).tail,(FunctionData *)0x0,
               (ScopeData *)module->currentBlock,VmType::Void);
    local_60 = pVVar11;
    for (variable._4_4_ = 0; uVar10 = variable._4_4_,
        uVar8 = SmallArray<VariableData_*,_4U>::size(&local_60->scope->allVariables), uVar10 < uVar8
        ; variable._4_4_ = variable._4_4_ + 1) {
      ppVVar12 = SmallArray<VariableData_*,_4U>::operator[]
                           (&local_60->scope->allVariables,variable._4_4_);
      _i_1 = *ppVVar12;
      if ((_i_1->isAlloca & 1U) != 0) {
        SmallArray<VariableData_*,_4U>::push_back(&local_60->allocas,(VariableData **)&i_1);
      }
    }
    function._4_4_ = 0;
    while( true ) {
      uVar10 = function._4_4_;
      uVar9 = SmallArray<TypeBase_*,_128U>::size(&ctx->types);
      uVar8 = function._4_4_;
      VVar4.structType = pTStack_c8;
      VVar4.type = uStack_d0;
      VVar4.size = k_1;
      VVar3.structType = local_c0.structType;
      VVar3.type = local_c0.type;
      VVar3.size = local_c0.size;
      if (uVar9 <= uVar10) break;
      ppTVar13 = SmallArray<TypeBase_*,_128U>::operator[](&ctx->types,function._4_4_);
      (*ppTVar13)->typeIndex = uVar8;
      function._4_4_ = function._4_4_ + 1;
    }
    function._0_4_ = 0;
    local_c0 = VVar3;
    _uStack_d0 = VVar4;
    while( true ) {
      uVar10 = (uint)function;
      uVar8 = SmallArray<FunctionData_*,_128U>::size(&ctx->functions);
      if (uVar8 <= uVar10) break;
      ppFVar14 = SmallArray<FunctionData_*,_128U>::operator[](&ctx->functions,(uint)function);
      vmFunction = (VmFunction *)*ppFVar14;
      bVar6 = ExpressionContext::IsGenericFunction(ctx,(FunctionData *)vmFunction);
      if ((!bVar6) &&
         (((((ulong)(vmFunction->restoreBlocks).little[1] & 1) == 0 ||
           ((vmFunction->restoreBlocks).little[2] == (VmBlock *)0x0)) &&
          (lVar1._0_4_ = vmFunction[2].super_VmValue.users.count,
          lVar1._4_4_ = vmFunction[2].super_VmValue.users.max, lVar1 == 0)))) {
        this_00 = VmModule::get<VmFunction>((VmModule *)global);
        allocator = (Allocator *)global[0xf].super_VmValue.comment.begin;
        VVar16 = GetVmType(ctx,ctx->typeFunctionID);
        pVVar11 = vmFunction;
        source = (SynBase *)(vmFunction->super_VmValue)._vptr_VmValue;
        scope = (ScopeData *)vmFunction[1].super_VmValue.users.little[3];
        local_c0 = VVar16;
        VVar16 = GetVmType(ctx,*(TypeBase **)((vmFunction->super_VmValue).comment.begin + 0x60));
        _uStack_d0 = VVar16;
        VmFunction::VmFunction
                  (this_00,allocator,local_c0,source,(FunctionData *)pVVar11,scope,VVar16);
        variable_1._4_4_ = 0;
        local_b0 = this_00;
        while( true ) {
          uVar10 = variable_1._4_4_;
          uVar8 = SmallArray<VariableData_*,_4U>::size(&local_b0->scope->allVariables);
          if (uVar8 <= uVar10) break;
          ppVVar12 = SmallArray<VariableData_*,_4U>::operator[]
                               (&local_b0->scope->allVariables,variable_1._4_4_);
          pVStack_e0 = *ppVVar12;
          if ((pVStack_e0->isAlloca & 1U) != 0) {
            SmallArray<VariableData_*,_4U>::push_back(&local_b0->allocas,&stack0xffffffffffffff20);
          }
          variable_1._4_4_ = variable_1._4_4_ + 1;
        }
        *(VmFunction **)&vmFunction[2].super_VmValue.users.count = local_b0;
        IntrusiveList<VmFunction>::push_back
                  ((IntrusiveList<VmFunction> *)&(global->super_VmValue).typeID,local_b0);
      }
      function._0_4_ = (uint)function + 1;
    }
    function_1._4_4_ = 0;
    while( true ) {
      uVar10 = SmallArray<FunctionData_*,_128U>::size(&ctx->functions);
      if (uVar10 <= function_1._4_4_) break;
      ppFVar14 = SmallArray<FunctionData_*,_128U>::operator[](&ctx->functions,function_1._4_4_);
      pFVar2 = *ppFVar14;
      if (((pFVar2->isPrototype & 1U) != 0) && (pFVar2->implementation != (FunctionData *)0x0)) {
        pFVar2->vmFunction = pFVar2->implementation->vmFunction;
      }
      function_1._4_4_ = function_1._4_4_ + 1;
    }
    block._4_4_ = 0;
    while( true ) {
      uVar10 = SmallArray<ExprBase_*,_32U>::size((SmallArray<ExprBase_*,_32U> *)&module->loopInfo);
      pVVar11 = global;
      if (uVar10 <= block._4_4_) break;
      ppEVar15 = SmallArray<ExprBase_*,_32U>::operator[]
                           ((SmallArray<ExprBase_*,_32U> *)&module->loopInfo,block._4_4_);
      CompileVm(ctx,(VmModule *)pVVar11,*ppEVar15);
      block._4_4_ = block._4_4_ + 1;
    }
    *(undefined1 *)&(global->super_VmValue).source = 1;
    (global->super_VmValue).comment.begin = (char *)local_60;
    block_00 = anon_unknown.dwarf_aa461::CreateBlock
                         ((VmModule *)global,(SynBase *)(module->functions).tail,"start");
    VmFunction::AddBlock(local_60,block_00);
    (global->super_VmValue).comment.end = (char *)block_00;
    VmValue::AddUse(&block_00->super_VmValue,&local_60->super_VmValue);
    for (value_1 = (ExprBase *)(module->loopInfo).little[0x10].continueBlock;
        value_1 != (ExprBase *)0x0; value_1 = value_1->next) {
      CompileVm(ctx,(VmModule *)global,value_1);
    }
    for (local_110 = (module->loopInfo).little[0x11].continueBlock; local_110 != (VmBlock *)0x0;
        local_110 = (VmBlock *)(local_110->super_VmValue).source) {
      CompileVm(ctx,(VmModule *)global,(ExprBase *)local_110);
    }
    IntrusiveList<VmFunction>::push_back
              ((IntrusiveList<VmFunction> *)&(global->super_VmValue).typeID,local_60);
    (global->super_VmValue).comment.begin = (char *)0x0;
    (global->super_VmValue).comment.end = (char *)0x0;
    ctx_local = (ExpressionContext *)global;
    VVar16 = local_c0;
    VVar5 = _uStack_d0;
  }
  local_c0 = VVar16;
  _uStack_d0 = VVar5;
  NULLC::TraceScope::~TraceScope((TraceScope *)&node);
  return (VmModule *)ctx_local;
}

Assistant:

VmModule* CompileVm(ExpressionContext &ctx, ExprBase *expression, const char *code)
{
	TRACE_SCOPE("InstructionTreeVm", "CompileVm");

	if(ExprModule *node = getType<ExprModule>(expression))
	{
		VmModule *module = new (ctx.get<VmModule>()) VmModule(ctx.allocator, code);

		// Generate global function
		VmFunction *global = new (module->get<VmFunction>()) VmFunction(module->allocator, VmType::Void, node->source, NULL, node->moduleScope, VmType::Void);

		for(unsigned k = 0; k < global->scope->allVariables.size(); k++)
		{
			VariableData *variable = global->scope->allVariables[k];

			if(variable->isAlloca)
				global->allocas.push_back(variable);
		}

		// Generate type indexes
		for(unsigned i = 0; i < ctx.types.size(); i++)
			ctx.types[i]->typeIndex = i;

		// Generate VmFunction object for each function
		for(unsigned i = 0; i < ctx.functions.size(); i++)
		{
			FunctionData *function = ctx.functions[i];

			if(ctx.IsGenericFunction(function))
				continue;

			// Skip prototypes that will have an implementation later
			if(function->isPrototype && function->implementation)
				continue;

			if(function->vmFunction)
				continue;

			VmFunction *vmFunction = new (module->get<VmFunction>()) VmFunction(module->allocator, GetVmType(ctx, ctx.typeFunctionID), function->source, function, function->functionScope, GetVmType(ctx, function->type->returnType));

			for(unsigned k = 0; k < vmFunction->scope->allVariables.size(); k++)
			{
				VariableData *variable = vmFunction->scope->allVariables[k];

				if(variable->isAlloca)
					vmFunction->allocas.push_back(variable);
			}

			function->vmFunction = vmFunction;

			module->functions.push_back(vmFunction);
		}

		for(unsigned i = 0; i < ctx.functions.size(); i++)
		{
			FunctionData *function = ctx.functions[i];

			if(function->isPrototype && function->implementation)
				function->vmFunction = function->implementation->vmFunction;
		}

		for(unsigned i = 0; i < node->definitions.size(); i++)
			CompileVm(ctx, module, node->definitions[i]);

		module->skipFunctionDefinitions = true;

		// Setup global function
		module->currentFunction = global;

		VmBlock *block = CreateBlock(module, node->source, "start");

		global->AddBlock(block);
		module->currentBlock = block;
		block->AddUse(global);

		for(ExprBase *value = node->setup.head; value; value = value->next)
			CompileVm(ctx, module, value);

		for(ExprBase *value = node->expressions.head; value; value = value->next)
			CompileVm(ctx, module, value);

		module->functions.push_back(global);

		module->currentFunction = NULL;
		module->currentBlock = NULL;

		return module;
	}

	return NULL;
}